

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O0

int configAssign(mpt_config *cfg,mpt_path *path,mpt_value *val)

{
  mpt_metatype *pmVar1;
  mpt_node *pmVar2;
  int local_5c;
  mpt_node *local_58;
  mpt_node *local_50;
  mpt_node *t;
  mpt_node *n;
  mpt_node **b;
  mpt_metatype *mt;
  mpt_configRoot *c;
  mpt_value *val_local;
  mpt_path *path_local;
  mpt_config *cfg_local;
  
  if (path == (mpt_path *)0x0) {
    cfg_local._4_4_ = -1;
  }
  else {
    t = nodeGlobal;
    n = (mpt_node *)&nodeGlobal;
    local_50 = (mpt_node *)0x0;
    if (cfg[3]._vptr != (_mpt_vptr_config *)0x0) {
      t = make_global((mpt_path *)(cfg + 1));
      if (t == (mpt_node *)0x0) {
        return -4;
      }
      local_58 = t;
      if (t->children != (mpt_node *)0x0) {
        local_58 = (mpt_node *)0x0;
      }
      local_50 = local_58;
      n = (mpt_node *)&t->children;
    }
    if (path->len == 0) {
      if (cfg[3]._vptr == (_mpt_vptr_config *)0x0) {
        cfg_local._4_4_ = -2;
      }
      else {
        cfg_local._4_4_ = mpt_meta_set(&t->_meta,val);
      }
    }
    else {
      pmVar2 = mpt_node_assign((mpt_node **)n,path,val);
      if (pmVar2 == (mpt_node *)0x0) {
        cfg_local._4_4_ = 0;
        if (val != (mpt_value *)0x0) {
          cfg_local._4_4_ = -4;
        }
      }
      else {
        if (local_50 != (mpt_node *)0x0) {
          local_50->children->parent = local_50;
        }
        pmVar1 = pmVar2->_meta;
        if (pmVar1 == (mpt_metatype *)0x0) {
          local_5c = 0;
        }
        else {
          local_5c = (*(pmVar1->_vptr->convertable).convert)
                               ((mpt_convertable *)pmVar1,0,(void *)0x0);
        }
        cfg_local._4_4_ = local_5c;
      }
    }
  }
  return cfg_local._4_4_;
}

Assistant:

static int configAssign(MPT_INTERFACE(config) *cfg, const MPT_STRUCT(path) *path, const MPT_STRUCT(value) *val)
{
	MPT_STRUCT(configRoot) *c = MPT_baseaddr(configRoot, cfg, _cfg);
	MPT_INTERFACE(metatype) *mt;
	MPT_STRUCT(node) **b, *n, *t;
	
	if (!path) {
		return MPT_ERROR(BadArgument);
	}
	n = nodeGlobal;
	b = &nodeGlobal;
	t = 0;
	
	/* get/create config base node */
	if (c->base.len) {
		if (!(n = make_global(&c->base))) {
			return MPT_ERROR(BadOperation);
		}
		t = n->children ? 0 : n;
		b = &n->children;
	}
	/* top level element */
	if (!path->len) {
		if (!c->base.len) {
			return MPT_ERROR(BadValue);
		}
		return mpt_meta_set(&n->_meta, val);
	}
	/* set subelement */
	if (!(n = mpt_node_assign(b, path, val))) {
		return val ? MPT_ERROR(BadOperation) : 0;
	}
	if (t) {
		t->children->parent = t;
	}
	mt = n->_meta;
	
	/* return data type identifier */
	return mt ? MPT_metatype_convert(mt, 0, 0) : 0;
}